

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O3

void mime_file_free(void *ptr)

{
  if (*(FILE **)((long)ptr + 0x48) != (FILE *)0x0) {
    fclose(*(FILE **)((long)ptr + 0x48));
    *(undefined8 *)((long)ptr + 0x48) = 0;
  }
  (*Curl_cfree)(*(void **)((long)ptr + 0x20));
  *(undefined8 *)((long)ptr + 0x20) = 0;
  return;
}

Assistant:

static void mime_file_free(void *ptr)
{
  curl_mimepart *part = (curl_mimepart *) ptr;

  if(part->fp) {
    fclose(part->fp);
    part->fp = NULL;
  }
  Curl_safefree(part->data);
  part->data = NULL;
}